

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

void bmp_mask_get_shift_and_prec(OPJ_UINT32 mask,OPJ_UINT32 *shift,OPJ_UINT32 *prec)

{
  undefined4 local_28;
  undefined4 local_24;
  OPJ_UINT32 l_prec;
  OPJ_UINT32 l_shift;
  OPJ_UINT32 *prec_local;
  OPJ_UINT32 *shift_local;
  OPJ_UINT32 mask_local;
  
  local_28 = 0;
  local_24 = 0;
  shift_local._4_4_ = mask;
  if (mask != 0) {
    for (; (shift_local._4_4_ & 1) == 0; shift_local._4_4_ = shift_local._4_4_ >> 1) {
      local_24 = local_24 + 1;
    }
    for (; (shift_local._4_4_ & 1) != 0; shift_local._4_4_ = shift_local._4_4_ >> 1) {
      local_28 = local_28 + 1;
    }
  }
  *shift = local_24;
  *prec = local_28;
  return;
}

Assistant:

static void bmp_mask_get_shift_and_prec(OPJ_UINT32 mask, OPJ_UINT32* shift,
                                        OPJ_UINT32* prec)
{
    OPJ_UINT32 l_shift, l_prec;

    l_shift = l_prec = 0U;

    if (mask != 0U) {
        while ((mask & 1U) == 0U) {
            mask >>= 1;
            l_shift++;
        }
        while (mask & 1U) {
            mask >>= 1;
            l_prec++;
        }
    }
    *shift = l_shift;
    *prec = l_prec;
}